

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_explain.cpp
# Opt level: O1

ExplainFormat duckdb::ParseFormat(Value *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ExplainFormat EVar2;
  iterator iVar3;
  InvalidInputException *pIVar4;
  long lVar5;
  __node_base _Var6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  options_list;
  string format_val;
  string allowed_options;
  case_insensitive_map_t<ExplainFormat> format_mapping;
  undefined1 local_1c9;
  string local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1a8;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  undefined1 local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 local_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if ((val->type_).id_ != VARCHAR) {
    pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"Expected a string as argument to FORMAT","");
    InvalidInputException::InvalidInputException(pIVar4,&local_130);
    __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  Value::GetValue<std::__cxx11::string>(&local_190,val);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"default","");
  local_110 = 0;
  local_108[0] = local_f8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"text","");
  local_e8 = 1;
  local_e0[0] = local_d0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"json","");
  local_c0 = 2;
  local_b8[0] = local_a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"html","");
  local_98 = 3;
  local_90[0] = local_80;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"graphviz","");
  local_70 = 4;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::ExplainFormat>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_68,&local_130,&local_68,0,&local_1c8,&local_1a8,&local_1c9);
  lVar5 = 0;
  do {
    if (local_80 + lVar5 != *(undefined1 **)((long)local_90 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_90 + lVar5));
    }
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -200);
  iVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_68,&local_190);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_true>
      ._M_cur != (__node_type *)0x0) {
    EVar2 = *(ExplainFormat *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_true>
                    ._M_cur + 0x28);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExplainFormat>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    return EVar2;
  }
  local_1a8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var6._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1a8,(value_type *)(_Var6._M_nxt + 1));
      _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt;
    } while (_Var6._M_nxt != (_Hash_node_base *)0x0);
  }
  paVar1 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,", ","");
  StringUtil::Join(&local_130,&local_1a8,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"\"%s\" is not a valid FORMAT argument, valid options are: %s","")
  ;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_190._M_dataplus._M_p,
             local_190._M_dataplus._M_p + local_190._M_string_length);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_130._M_dataplus._M_p,
             local_130._M_dataplus._M_p + local_130._M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
            (pIVar4,&local_1c8,&local_150,&local_170);
  __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ExplainFormat ParseFormat(const Value &val) {
	if (val.type().id() != LogicalTypeId::VARCHAR) {
		throw InvalidInputException("Expected a string as argument to FORMAT");
	}
	auto format_val = val.GetValue<string>();
	case_insensitive_map_t<ExplainFormat> format_mapping {
	    {"default", ExplainFormat::DEFAULT}, {"text", ExplainFormat::TEXT},         {"json", ExplainFormat::JSON},
	    {"html", ExplainFormat::HTML},       {"graphviz", ExplainFormat::GRAPHVIZ},
	};
	auto it = format_mapping.find(format_val);
	if (it != format_mapping.end()) {
		return it->second;
	}
	vector<string> options_list;
	for (auto &it : format_mapping) {
		options_list.push_back(it.first);
	}
	auto allowed_options = StringUtil::Join(options_list, ", ");
	throw InvalidInputException("\"%s\" is not a valid FORMAT argument, valid options are: %s", format_val,
	                            allowed_options);
}